

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderInvalidArrayedInputVariablesTest::initShaderObjects
          (GeometryShaderInvalidArrayedInputVariablesTest *this,GLenum gs_input_primitive_type,
          bool *out_has_fs_compiled_successfully,bool *out_has_gs_compiled_successfully,
          bool *out_has_vs_compiled_successfully)

{
  bool *pbVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  GLuint *pGVar6;
  uint n_shader_type;
  GLint compile_status;
  GLuint *local_100;
  GLuint *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  bool *local_d8;
  bool *local_d0;
  bool *local_c8;
  char *so_code;
  string specialized_vs_code;
  string specialized_gs_code;
  char *gs_code_raw;
  string gs_code;
  string specialized_fs_code;
  long lVar5;
  
  local_d8 = out_has_fs_compiled_successfully;
  local_d0 = out_has_gs_compiled_successfully;
  local_c8 = out_has_vs_compiled_successfully;
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  TestCaseBase::specializeShader_abi_cxx11_
            (&specialized_fs_code,&this->super_TestCaseBase,1,&dummy_fs_code);
  local_e0 = specialized_fs_code._M_dataplus._M_p;
  getGSCode_abi_cxx11_(&gs_code,this,gs_input_primitive_type);
  gs_code_raw = gs_code._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (&specialized_gs_code,&this->super_TestCaseBase,1,&gs_code_raw);
  local_e8 = specialized_gs_code._M_dataplus._M_p;
  getSpecializedVSCode_abi_cxx11_(&specialized_vs_code,this);
  local_f0 = specialized_vs_code._M_dataplus._M_p;
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar3;
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8dd9);
  this->m_gs_id = GVar3;
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                  ,0x2f1);
  local_f8 = &this->m_fs_id;
  local_100 = &this->m_gs_id;
  for (iVar2 = 0; iVar2 != 3; iVar2 = iVar2 + 1) {
    compile_status = 0;
    pGVar6 = &this->m_vs_id;
    pbVar1 = local_c8;
    so_code = local_f0;
    if (iVar2 == 1) {
      pGVar6 = local_100;
      pbVar1 = local_d0;
      so_code = local_e8;
    }
    if (iVar2 == 0) {
      pGVar6 = local_f8;
      pbVar1 = local_d8;
      so_code = local_e0;
    }
    GVar3 = *pGVar6;
    (**(code **)(lVar5 + 0x12b8))(GVar3,1,&so_code,0);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glShaderSource() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x304);
    (**(code **)(lVar5 + 0x248))(GVar3);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glCompileShader() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x307);
    (**(code **)(lVar5 + 0xa70))(GVar3,0x8b81,&compile_status);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glGetShaderiv() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x30a);
    *pbVar1 = compile_status == 1;
  }
  std::__cxx11::string::~string((string *)&specialized_vs_code);
  std::__cxx11::string::~string((string *)&specialized_gs_code);
  std::__cxx11::string::~string((string *)&gs_code);
  std::__cxx11::string::~string((string *)&specialized_fs_code);
  return;
}

Assistant:

void GeometryShaderInvalidArrayedInputVariablesTest::initShaderObjects(glw::GLenum gs_input_primitive_type,
																	   bool*	   out_has_fs_compiled_successfully,
																	   bool*	   out_has_gs_compiled_successfully,
																	   bool*	   out_has_vs_compiled_successfully)
{
	const glw::Functions& gl					  = m_context.getRenderContext().getFunctions();
	std::string			  specialized_fs_code	 = specializeShader(1, &dummy_fs_code);
	const char*			  specialized_fs_code_raw = specialized_fs_code.c_str();
	std::string			  gs_code				  = getGSCode(gs_input_primitive_type);
	const char*			  gs_code_raw			  = gs_code.c_str();
	std::string			  specialized_gs_code	 = specializeShader(1, &gs_code_raw);
	const char*			  specialized_gs_code_raw = specialized_gs_code.c_str();
	std::string			  specialized_vs_code	 = getSpecializedVSCode();
	const char*			  specialized_vs_code_raw = specialized_vs_code.c_str();

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	for (unsigned int n_shader_type = 0; n_shader_type < 3; /* fs, gs, vs */
		 n_shader_type++)
	{
		glw::GLint compile_status	 = GL_FALSE;
		bool*	  out_compile_result = (n_shader_type == 0) ? out_has_fs_compiled_successfully :
														  (n_shader_type == 1) ? out_has_gs_compiled_successfully :
																				 out_has_vs_compiled_successfully;

		const char* so_code = (n_shader_type == 0) ?
								  specialized_fs_code_raw :
								  (n_shader_type == 1) ? specialized_gs_code_raw : specialized_vs_code_raw;

		glw::GLuint so_id = (n_shader_type == 0) ? m_fs_id : (n_shader_type == 1) ? m_gs_id : m_vs_id;

		gl.shaderSource(so_id, 1,			/* count */
						&so_code, DE_NULL); /* length */

		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed");

		gl.compileShader(so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed");

		gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed");

		*out_compile_result = (compile_status == GL_TRUE);
	} /* for (both shader stages) */
}